

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O3

int __thiscall ReadData::ReadObs(ReadData *this,BUFF *socketdata,uchar *HeadBuff)

{
  SATTIME *pSVar1;
  int MessageLength;
  uint uVar2;
  int iVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint *Message;
  long lVar8;
  uint uVar9;
  uint uVar10;
  undefined1 *puVar11;
  long lVar12;
  
  iVar6 = 6;
  if ((this->Head).MessageID == 0x2b) {
    iVar6 = socketdata->pos;
    MessageLength = (this->Head).MessageLength;
    if (socketdata->len - iVar6 < MessageLength) {
      socketdata->pos = iVar6 + -0x1c;
      iVar6 = 2;
    }
    else {
      iVar3 = (int)((long)MessageLength + 4U);
      iVar7 = -1;
      if (-5 < MessageLength) {
        iVar7 = iVar3;
      }
      Message = (uint *)operator_new__((long)iVar7);
      memcpy(Message,socketdata->buff + iVar6,(long)MessageLength + 4U);
      socketdata->pos = iVar6 + iVar3;
      uVar2 = *Message;
      bVar5 = CRCCheck(HeadBuff,(uchar *)Message,MessageLength,MessageLength);
      if (bVar5) {
        lVar8 = 0;
        do {
          *(undefined8 *)(&this->field_0x1c10 + lVar8) = 0xbff0000000000000;
          *(undefined8 *)((long)(&this->field_0x1c10 + lVar8) + 8) = 0xbff0000000000000;
          lVar8 = lVar8 + 0x70;
        } while (lVar8 != 0xe00);
        lVar8 = 0x10;
        do {
          *(undefined8 *)(&this->field_0x0 + lVar8) = 0xbff0000000000000;
          *(undefined8 *)((long)(&this->field_0x0 + lVar8) + 8) = 0xbff0000000000000;
          lVar8 = lVar8 + 0x70;
        } while (lVar8 != 0x1c10);
        if (0 < (int)uVar2) {
          pSVar1 = &(this->Head).GPST;
          lVar8 = 0;
          do {
            uVar9 = *(uint *)((long)Message + lVar8 + 0x2c);
            uVar10 = uVar9 >> 0x10 & 7;
            if (uVar10 == 0) {
              uVar9 = uVar9 >> 0x15 & 0x1f;
              lVar12 = (ulong)(*(ushort *)((long)Message + lVar8 + 4) - 1 & 0xffff) * 0x70;
              puVar11 = &this->field_0x1c00 + lVar12;
              dVar4 = (this->Head).GPST.SOW;
              *(undefined8 *)(&this->field_0x1c00 + lVar12) = *(undefined8 *)pSVar1;
              *(double *)((long)(&this->field_0x1c00 + lVar12) + 8) = dVar4;
              if (uVar9 != 9) goto LAB_001094fb;
LAB_0010958f:
              *(undefined8 *)(puVar11 + 0x18) = *(undefined8 *)((long)Message + lVar8 + 8);
              *(undefined4 *)(puVar11 + 0x24) = *(undefined4 *)((long)Message + lVar8 + 0x10);
              *(undefined8 *)(puVar11 + 0x30) = *(undefined8 *)((long)Message + lVar8 + 0x14);
              *(undefined4 *)(puVar11 + 0x3c) = *(undefined4 *)((long)Message + lVar8 + 0x1c);
              *(undefined4 *)(puVar11 + 0x44) = *(undefined4 *)((long)Message + lVar8 + 0x20);
              *(undefined4 *)(puVar11 + 0x4c) = *(undefined4 *)((long)Message + lVar8 + 0x24);
              *(undefined4 *)(puVar11 + 0x54) = *(undefined4 *)((long)Message + lVar8 + 0x28);
            }
            else if (uVar10 == 4) {
              lVar12 = (ulong)(*(ushort *)((long)Message + lVar8 + 4) - 1 & 0xffff) * 0x70;
              puVar11 = &this->field_0x0 + lVar12;
              dVar4 = (this->Head).GPST.SOW;
              *(undefined8 *)(&this->field_0x0 + lVar12) = *(undefined8 *)pSVar1;
              *(double *)((long)(&this->field_0x0 + lVar12) + 8) = dVar4;
              uVar9 = uVar9 & 0x3600000;
              if (uVar9 == 0x400000) goto LAB_0010958f;
LAB_001094fb:
              if (uVar9 == 0) {
                *(undefined8 *)(puVar11 + 0x10) = *(undefined8 *)((long)Message + lVar8 + 8);
                *(undefined4 *)(puVar11 + 0x20) = *(undefined4 *)((long)Message + lVar8 + 0x10);
                *(undefined8 *)(puVar11 + 0x28) = *(undefined8 *)((long)Message + lVar8 + 0x14);
                *(undefined4 *)(puVar11 + 0x38) = *(undefined4 *)((long)Message + lVar8 + 0x1c);
                *(undefined4 *)(puVar11 + 0x40) = *(undefined4 *)((long)Message + lVar8 + 0x20);
                *(undefined4 *)(puVar11 + 0x48) = *(undefined4 *)((long)Message + lVar8 + 0x24);
                *(undefined4 *)(puVar11 + 0x50) = *(undefined4 *)((long)Message + lVar8 + 0x28);
              }
            }
            lVar8 = lVar8 + 0x2c;
          } while ((ulong)uVar2 * 0x2c - lVar8 != 0);
        }
        operator_delete__(Message);
        iVar6 = 0;
      }
      else {
        operator_delete__(Message);
        iVar6 = 3;
      }
    }
  }
  return iVar6;
}

Assistant:

int ReadData::ReadObs(BUFF &socketdata, unsigned char* HeadBuff) {
    if(Head.MessageID != 43)
        return CONFLICT_ID;
    if(socketdata.len - socketdata.pos < Head.MessageLength) {
        socketdata.pos -= 28;
        // reset(socketdata, pos);
        return FILE_OR_BUFF_END;
    }
    char* buff = new char [Head.MessageLength + 4];
    memcpy(buff, socketdata.buff + socketdata.pos, Head.MessageLength + 4);
    socketdata.pos += Head.MessageLength + 4;

    int obsNum = U2I((unsigned char*)(buff), 4);
    if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, Head.MessageLength)){
        delete[] buff;
        return CRC_FAILED;
    }

    for(int prn = 0; prn < MAXGPSSRN; ++prn){
        this->GPSObs[prn].psr[0] = -1;
        this->GPSObs[prn].psr[1] = -1;
    }
    for(int prn = 0; prn < MAXBDSSRN; ++prn){
        this->BDSObs[prn].psr[0] = -1;
        this->BDSObs[prn].psr[1] = -1;
    }
    try
    {
        for(int i = 0; i < obsNum; ++i)
        {
            int ChannelState = U2I((unsigned char*)(buff + i * 44 + 44), 4);
            int sys = (ChannelState >> 16) & 7;
            switch(sys)
            {
                case BDS:
                {
                    int SignalType = (ChannelState >> 21) & 31;
                    unsigned short int PRN = U2I((unsigned char*)(buff + i * 44 + 4), 2) - 1;
                    this->BDSObs[PRN].ObsTime = Head.GPST;

                    // B1 signal
                    if(SignalType == 0 || SignalType == 4)
                    {
                        // cout << "B1   " << PRN << endl;
                        this->BDSObs[PRN].psr[0] = C2D(buff + i * 44 + 8, 8);
                        this->BDSObs[PRN].psr_sigma[0] = C2F(buff + i * 44 + 16, 4);
                        this->BDSObs[PRN].adr[0] = C2D(buff + i * 44 + 20, 8);
                        this->BDSObs[PRN].adr_sigma[0] = C2F(buff + i * 44 + 28, 4);
                        this->BDSObs[PRN].dopp[0] = C2F(buff + i * 44 + 32, 4);
                        this->BDSObs[PRN].CNo[0] = C2F(buff + i * 44 + 36, 4);
                        this->BDSObs[PRN].LockTime[0] = C2F(buff + i * 44 + 40, 4);
                    }
                    // B3 signal
                    if(SignalType == 2 || SignalType == 6)
                    {
                        // cout << "B3   " << PRN << endl;
                        this->BDSObs[PRN].psr[1] = C2D(buff + i * 44 + 8, 8);
                        this->BDSObs[PRN].psr_sigma[1] = C2F(buff + i * 44 + 16, 4);
                        this->BDSObs[PRN].adr[1] = C2D(buff + i * 44 + 20, 8);
                        this->BDSObs[PRN].adr_sigma[1] = C2F(buff + i * 44 + 28, 4);
                        this->BDSObs[PRN].dopp[1] = C2F(buff + i * 44 + 32, 4);
                        this->BDSObs[PRN].CNo[1] = C2F(buff + i * 44 + 36, 4);
                        this->BDSObs[PRN].LockTime[1] = C2F(buff + i * 44 + 40, 4);
                    }
                    break;
                }
                case GPS:
                {
                    int SignalType = (ChannelState >> 21) & 31;
                    unsigned short int PRN = U2I((unsigned char*)(buff + i * 44 + 4), 2) - 1;
                    this->GPSObs[PRN].ObsTime = Head.GPST;
                    // L1 C/A
                    if(SignalType == 0)
                    {
                        this->GPSObs[PRN].psr[0] = C2D(buff + i * 44 + 8, 8);
                        this->GPSObs[PRN].psr_sigma[0] = C2F(buff + i * 44 + 16, 4);
                        this->GPSObs[PRN].adr[0] = C2D(buff + i * 44 + 20, 8);
                        this->GPSObs[PRN].adr_sigma[0] = C2F(buff + i * 44 + 28, 4);
                        this->GPSObs[PRN].dopp[0] = C2F(buff + i * 44 + 32, 4);
                        this->GPSObs[PRN].CNo[0] = C2F(buff + i * 44 + 36, 4);
                        this->GPSObs[PRN].LockTime[0] = C2F(buff + i * 44 + 40, 4);
                    }
                    // L2P
                    if(SignalType == 9)
                    {
                        this->GPSObs[PRN].psr[1] = C2D(buff + i * 44 + 8, 8);
                        this->GPSObs[PRN].psr_sigma[1] = C2F(buff + i * 44 + 16, 4);
                        this->GPSObs[PRN].adr[1] = C2D(buff + i * 44 + 20, 8);
                        this->GPSObs[PRN].adr_sigma[1] = C2F(buff + i * 44 + 28, 4);
                        this->GPSObs[PRN].dopp[1] = C2F(buff + i * 44 + 32, 4);
                        this->GPSObs[PRN].CNo[1] = C2F(buff + i * 44 + 36, 4);
                        this->GPSObs[PRN].LockTime[1] = C2F(buff + i * 44 + 40, 4);
                    }
                    break;
                }
                default: break;
            }
        }
    }
    catch(...)
    {
        cout << "error happened when reading obs" << endl;
        return UNKNOWN_ERROR;
    }
    delete[] buff;
    return 0;
    
}